

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcore_unix.cpp
# Opt level: O3

QByteArray * qt_readlink(QByteArray *__return_storage_ptr__,char *path)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  undefined1 *size;
  int *piVar4;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_38,0x100,Uninitialized);
  if ((&(local_38.d.d)->super_QArrayData == (QArrayData *)0x0) ||
     (1 < ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(&local_38,local_38.d.size,KeepSize);
  }
  size = (undefined1 *)readlink(path,local_38.d.ptr,local_38.d.size);
  if (size == (undefined1 *)local_38.d.size) {
    do {
      if ((undefined1 *)0xfff < size) {
        piVar4 = __errno_location();
        *piVar4 = 0x24;
        goto LAB_001340c8;
      }
      QByteArray::resize(&local_38,(long)size * 2);
      if ((&(local_38.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(&local_38,local_38.d.size,KeepSize);
      }
      size = (undefined1 *)readlink(path,local_38.d.ptr,local_38.d.size);
    } while (size == (undefined1 *)local_38.d.size);
  }
  if (size == (undefined1 *)0xffffffffffffffff) {
LAB_001340c8:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QByteArray::resize(&local_38,(qsizetype)size);
    qVar3 = local_38.d.size;
    pcVar2 = local_38.d.ptr;
    pDVar1 = local_38.d.d;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_38.d.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray qt_readlink(const char *path)
{
#ifndef PATH_MAX
    // suitably large value that won't consume too much memory
#  define PATH_MAX  1024*1024
#endif

    QByteArray buf(256, Qt::Uninitialized);

    ssize_t len = ::readlink(path, buf.data(), buf.size());
    while (len == buf.size()) {
        // readlink(2) will fill our buffer and not necessarily terminate with NUL;
        if (buf.size() >= PATH_MAX) {
            errno = ENAMETOOLONG;
            return QByteArray();
        }

        // double the size and try again
        buf.resize(buf.size() * 2);
        len = ::readlink(path, buf.data(), buf.size());
    }

    if (len == -1)
        return QByteArray();

    buf.resize(len);
    return buf;
}